

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O1

int __thiscall CVmObjDict::getp_add(CVmObjDict *this,vm_obj_id_t self,vm_val_t *val,uint *argc)

{
  CVmObjPageEntry *pCVar1;
  int iVar2;
  vm_prop_id_t voc_prop;
  int iVar3;
  vm_obj_id_t obj;
  long lVar4;
  ushort *puVar5;
  vm_obj_id_t vVar6;
  vm_val_t str_val;
  vm_val_t ele_val;
  vm_val_t local_68;
  vm_val_t *local_58;
  vm_val_t local_50;
  vm_val_t local_40;
  
  if (getp_add(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_add();
  }
  iVar3 = CVmObject::get_prop_check_argc(val,argc,&getp_add::desc);
  if (iVar3 != 0) {
    return 1;
  }
  local_58 = val;
  obj = CVmBif::pop_obj_val();
  local_68.typ = sp_[-1].typ;
  local_68._4_4_ = *(undefined4 *)&sp_[-1].field_0x4;
  local_68.val = sp_[-1].val;
  sp_ = sp_ + -1;
  voc_prop = CVmBif::pop_propid_val();
  pCVar1 = G_obj_table_X.pages_[obj >> 0xc] + (obj & 0xfff);
  lVar4 = (**(code **)(*(long *)&pCVar1->ptr_ + 400))(pCVar1);
  if ((lVar4 != 0) || (lVar4 = (**(code **)(*(long *)&pCVar1->ptr_ + 0x1a8))(pCVar1), lVar4 != 0)) {
    err_throw(0x7da);
  }
  iVar3 = vm_val_t::is_listlike(&local_68);
  if (iVar3 != 0) {
    iVar3 = vm_val_t::ll_length(&local_68);
    if (-1 < iVar3) {
      if (iVar3 != 0) {
        vVar6 = 1;
        do {
          local_50.typ = VM_INT;
          local_50.val.obj = vVar6;
          vm_val_t::ll_index(&local_68,&local_40,&local_50);
          puVar5 = (ushort *)vm_val_t::get_as_string(&local_40);
          if (puVar5 == (ushort *)0x0) goto LAB_0027caea;
          add_word(this,self,(char *)(puVar5 + 1),(ulong)*puVar5,obj,voc_prop);
          iVar2 = (1 - iVar3) + vVar6;
          vVar6 = vVar6 + 1;
        } while (iVar2 != 1);
      }
      goto LAB_0027cacb;
    }
  }
  puVar5 = (ushort *)vm_val_t::get_as_string(&local_68);
  if (puVar5 == (ushort *)0x0) {
LAB_0027caea:
    err_throw(0x7e3);
  }
  add_word(this,self,(char *)(puVar5 + 1),(ulong)*puVar5,obj,voc_prop);
LAB_0027cacb:
  local_58->typ = VM_NIL;
  return 1;
}

Assistant:

int CVmObjDict::getp_add(VMG_ vm_obj_id_t self, vm_val_t *val, uint *argc)
{
    vm_obj_id_t obj;
    vm_val_t str_val;
    vm_prop_id_t voc_prop;
    CVmObject *objp;
    int lstcnt;
    const char *str;
    static CVmNativeCodeDesc desc(3);

    /* check arguments */
    if (get_prop_check_argc(val, argc, &desc))
        return TRUE;

    /* pop the object, word string, and property ID arguments */
    obj = CVmBif::pop_obj_val(vmg0_);
    G_stk->pop(&str_val);
    voc_prop = CVmBif::pop_propid_val(vmg0_);

    /* ensure that the object value isn't a string or list */
    objp = vm_objp(vmg_ obj);
    if (objp->get_as_list() != 0 || objp->get_as_string(vmg0_) != 0)
        err_throw(VMERR_OBJ_VAL_REQD);

    /* if the string argument is a list, add each word from the list */
    if (str_val.is_listlike(vmg0_)
        && (lstcnt = str_val.ll_length(vmg0_)) >= 0)
    {
        /* iterate over the list, using 1-based indices */
        for (int idx = 1 ; idx <= lstcnt ; ++idx)
        {
            /* get the next value from the list */
            vm_val_t ele_val;
            str_val.ll_index(vmg_ &ele_val, idx);

            /* get the next string value */
            if ((str = ele_val.get_as_string(vmg0_)) == 0)
                err_throw(VMERR_STRING_VAL_REQD);

            /* set this string */
            add_word(vmg_ self, str, obj, voc_prop);
        }
    }
    else if ((str = str_val.get_as_string(vmg0_)) != 0)
    {
        /* add the string */
        add_word(vmg_ self, str, obj, voc_prop);
    }
    else
    {
        /* string value required */
        err_throw(VMERR_STRING_VAL_REQD);
    }

    /* there's no return value */
    val->set_nil();

    /* success */
    return TRUE;
}